

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O2

void __thiscall cursespp::ScrollableWindow::OnAdapterChanged(ScrollableWindow *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar5;
  
  iVar3 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x42])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x19])(this);
  iVar4 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x18])(this);
  (**(code **)(*plVar5 + 0x10))(plVar5,(long)iVar3,(long)iVar4);
  bVar2 = IsLastItemVisible(this);
  pp_Var1 = (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable;
  if (bVar2) {
    (*pp_Var1[0x3a])(this);
    return;
  }
  iVar3 = (*pp_Var1[0x43])(this);
  (**(code **)(*plVar5 + 0x28))
            (plVar5,this,*(undefined8 *)CONCAT44(extraout_var_00,iVar3),
             (undefined8 *)CONCAT44(extraout_var_00,iVar3));
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[4])(this);
  return;
}

Assistant:

void ScrollableWindow::OnAdapterChanged() {
    IScrollAdapter *adapter = &GetScrollAdapter();

    adapter->SetDisplaySize(GetContentWidth(), GetContentHeight());

    if (IsLastItemVisible()) {
        this->ScrollToBottom();
    }
    else {
        ScrollPos &pos = this->GetMutableScrollPosition();
        adapter->DrawPage(this, pos.firstVisibleEntryIndex, pos);
        this->Invalidate();
    }
}